

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

bstring bformat(char *fmt,...)

{
  bool bVar1;
  char in_AL;
  int iVar2;
  size_t sVar3;
  bstring b;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  int iVar4;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arglist;
  undefined8 local_108;
  void **local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if (fmt != (char *)0x0) {
    local_e0 = in_RSI;
    local_d8 = in_RDX;
    local_d0 = in_RCX;
    local_c8 = in_R8;
    local_c0 = in_R9;
    sVar3 = strlen(fmt);
    iVar2 = (int)sVar3 * 2;
    iVar4 = 0x10;
    if (0x10 < iVar2) {
      iVar4 = iVar2;
    }
    b = bfromcstrrangealloc(iVar4 + 2,iVar4 + 2,anon_var_dwarf_2abd1 + 0x10);
    if (b == (bstring)0x0) {
      b = bfromcstrrangealloc(3,3,anon_var_dwarf_2abd1 + 0x10);
      if (b == (bstring)0x0) {
        return (bstring)0x0;
      }
      iVar4 = 1;
    }
    do {
      local_f8 = local_e8;
      local_100 = &arglist[0].overflow_arg_area;
      local_108 = 0x3000000008;
      iVar2 = vsnprintf((char *)b->data,(long)(iVar4 + 1),fmt,&local_108);
      b->data[iVar4] = '\0';
      sVar3 = strlen((char *)b->data);
      b->slen = (int)sVar3;
      if ((int)sVar3 < iVar4) {
        return b;
      }
      bVar1 = iVar4 < iVar2;
      iVar4 = iVar4 * 2;
      if (bVar1) {
        iVar4 = iVar2;
      }
      iVar2 = balloc(b,iVar4 + 2);
    } while (iVar2 == 0);
    bdestroy(b);
  }
  return (bstring)0x0;
}

Assistant:

bstring bformat (const char * fmt, ...) {
va_list arglist;
bstring buff;
int n, r;

	if (fmt == NULL) return NULL;

	/* Since the length is not determinable beforehand, a search is
	   performed using the truncating "vsnprintf" call (to avoid buffer
	   overflows) on increasing potential sizes for the output result. */

	if ((n = (int) (2*strlen (fmt))) < START_VSNBUFF) n = START_VSNBUFF;
	if (NULL == (buff = bfromcstralloc (n + 2, ""))) {
		n = 1;
		if (NULL == (buff = bfromcstralloc (n + 2, ""))) return NULL;
	}

	for (;;) {
		va_start (arglist, fmt);
		exvsnprintf (r, (char *) buff->data, n + 1, fmt, arglist);
		va_end (arglist);

		buff->data[n] = (unsigned char) '\0';
		buff->slen = (int) (strlen) ((char *) buff->data);

		if (buff->slen < n) break;

		if (r > n) n = r; else n += n;

		if (BSTR_OK != balloc (buff, n + 2)) {
			bdestroy (buff);
			return NULL;
		}
	}

	return buff;
}